

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_disk_directory_traversals.c
# Opt level: O0

void test_symlink_hybrid(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  char *pcVar4;
  la_int64_t lVar5;
  int iVar6;
  int local_34;
  la_int64_t lStack_30;
  int file_count;
  int64_t offset;
  size_t size;
  void *p;
  archive_entry *ae;
  archive *a;
  
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'ɉ');
    test_skipping("Can\'t test symlinks on this filesystem");
  }
  else {
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'ɐ',"h",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                    ,L'ɑ',"h");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'ɒ',"d1",L'ǭ');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'ɓ',"ld1","d1",L'\x01');
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ɔ',"d1/file1",L'Ƥ',L'\xffffffff',"d1/file1");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ɕ',"d1/file2",L'Ƥ',L'\xffffffff',"d1/file2");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'ɖ',"d1/link1","file1",L'\0');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'ɗ',"d1/linkX","fileX",L'\0');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'ɘ',"link2","d1/file2",L'\0');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'ə',"linkY","d1/fileY",L'\0');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                    ,L'ɚ',"..");
    p = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'ɜ',(uint)((archive_entry *)p != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    ae = (archive_entry *)archive_read_disk_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'ɝ',(uint)(ae != (archive_entry *)0x0),
                     "(a = archive_read_disk_new()) != NULL",(void *)0x0);
    wVar1 = archive_read_disk_set_symlink_hybrid((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ɟ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_set_symlink_hybrid(a)",
                        ae);
    wVar1 = archive_read_disk_open((archive *)ae,"h/ld1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ɤ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_open(a, \"h/ld1\")",ae)
    ;
    local_34 = 5;
    while (iVar6 = local_34 + -1, local_34 != 0) {
      iVar2 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'ɨ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header2(a, ae)",ae);
      pcVar4 = archive_entry_pathname((archive_entry *)p);
      iVar2 = strcmp(pcVar4,"h/ld1");
      if (iVar2 == 0) {
        mVar3 = archive_entry_filetype((archive_entry *)p);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'ɪ',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                            (void *)0x0);
      }
      else {
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"h/ld1/file1");
        if (iVar2 == 0) {
          mVar3 = archive_entry_filetype((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɭ',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                              (void *)0x0);
          lVar5 = archive_entry_size((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɮ',lVar5,"archive_entry_size(ae)",8,"8",(void *)0x0);
          iVar2 = archive_read_data_block
                            ((archive *)ae,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffd0
                            );
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɰ',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_data_block(a, &p, &size, &offset)",ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɱ',(long)(int)offset,"(int)size",8,"8",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɲ',(long)(int)lStack_30,"(int)offset",0,"0",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɳ',(void *)size,"p","d1/file1","\"d1/file1\"",8,"8",(void *)0x0);
          iVar2 = archive_read_data_block
                            ((archive *)ae,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffd0
                            );
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɵ',1,"ARCHIVE_EOF",(long)iVar2,
                              "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɶ',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ɷ',(long)(int)lStack_30,"(int)offset",8,"8",(void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)p);
          iVar2 = strcmp(pcVar4,"h/ld1/file2");
          if (iVar2 == 0) {
            mVar3 = archive_entry_filetype((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ɺ',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                                (void *)0x0);
            lVar5 = archive_entry_size((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ɻ',lVar5,"archive_entry_size(ae)",8,"8",(void *)0x0);
            iVar2 = archive_read_data_block
                              ((archive *)ae,(void **)&size,(size_t *)&offset,
                               &stack0xffffffffffffffd0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ɽ',0,"ARCHIVE_OK",(long)iVar2,
                                "archive_read_data_block(a, &p, &size, &offset)",ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ɾ',(long)(int)offset,"(int)size",8,"8",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ɿ',(long)(int)lStack_30,"(int)offset",0,"0",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʀ',(void *)size,"p","d1/file2","\"d1/file2\"",8,"8",(void *)0x0)
            ;
            iVar2 = archive_read_data_block
                              ((archive *)ae,(void **)&size,(size_t *)&offset,
                               &stack0xffffffffffffffd0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʂ',1,"ARCHIVE_EOF",(long)iVar2,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʃ',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʄ',(long)(int)lStack_30,"(int)offset",8,"8",(void *)0x0);
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)p);
            iVar2 = strcmp(pcVar4,"h/ld1/link1");
            if (iVar2 == 0) {
              mVar3 = archive_entry_filetype((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʇ',(ulong)mVar3,"archive_entry_filetype(ae)",0xa000,"AE_IFLNK"
                                  ,(void *)0x0);
            }
            else {
              pcVar4 = archive_entry_pathname((archive_entry *)p);
              iVar2 = strcmp(pcVar4,"h/ld1/linkX");
              if (iVar2 == 0) {
                mVar3 = archive_entry_filetype((archive_entry *)p);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                    ,L'ʊ',(ulong)mVar3,"archive_entry_filetype(ae)",0xa000,
                                    "AE_IFLNK",(void *)0x0);
              }
            }
          }
        }
      }
      mVar3 = archive_entry_filetype((archive_entry *)p);
      local_34 = iVar6;
      if (mVar3 == 0x4000) {
        wVar1 = archive_read_disk_descend((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'ʏ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_descend(a)",ae);
      }
    }
    iVar6 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ʓ',1,"ARCHIVE_EOF",(long)iVar6,"archive_read_next_header2(a, ae)",ae);
    iVar6 = archive_read_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ʕ',0,"ARCHIVE_OK",(long)iVar6,"archive_read_close(a)",(void *)0x0);
    wVar1 = archive_read_disk_open((archive *)ae,"h");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ʚ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_open(a, \"h\")",ae);
    local_34 = 9;
    while (iVar6 = local_34 + -1, local_34 != 0) {
      iVar2 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'ʞ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header2(a, ae)",ae);
      pcVar4 = archive_entry_pathname((archive_entry *)p);
      iVar2 = strcmp(pcVar4,"h");
      if (iVar2 == 0) {
        mVar3 = archive_entry_filetype((archive_entry *)p);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'ʠ',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                            (void *)0x0);
      }
      else {
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"h/d1");
        if (iVar2 == 0) {
          mVar3 = archive_entry_filetype((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'ʢ',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                              (void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)p);
          iVar2 = strcmp(pcVar4,"h/d1/file1");
          if (iVar2 == 0) {
            mVar3 = archive_entry_filetype((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʥ',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG",
                                (void *)0x0);
            lVar5 = archive_entry_size((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʦ',lVar5,"archive_entry_size(ae)",8,"8",(void *)0x0);
            iVar2 = archive_read_data_block
                              ((archive *)ae,(void **)&size,(size_t *)&offset,
                               &stack0xffffffffffffffd0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʨ',0,"ARCHIVE_OK",(long)iVar2,
                                "archive_read_data_block(a, &p, &size, &offset)",ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʩ',(long)(int)offset,"(int)size",8,"8",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʪ',(long)(int)lStack_30,"(int)offset",0,"0",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʫ',(void *)size,"p","d1/file1","\"d1/file1\"",8,"8",(void *)0x0)
            ;
            iVar2 = archive_read_data_block
                              ((archive *)ae,(void **)&size,(size_t *)&offset,
                               &stack0xffffffffffffffd0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʭ',1,"ARCHIVE_EOF",(long)iVar2,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʮ',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ʯ',(long)(int)lStack_30,"(int)offset",8,"8",(void *)0x0);
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)p);
            iVar2 = strcmp(pcVar4,"h/d1/file2");
            if (iVar2 == 0) {
              mVar3 = archive_entry_filetype((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʲ',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,"AE_IFREG"
                                  ,(void *)0x0);
              lVar5 = archive_entry_size((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʳ',lVar5,"archive_entry_size(ae)",8,"8",(void *)0x0);
              iVar2 = archive_read_data_block
                                ((archive *)ae,(void **)&size,(size_t *)&offset,
                                 &stack0xffffffffffffffd0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʵ',0,"ARCHIVE_OK",(long)iVar2,
                                  "archive_read_data_block(a, &p, &size, &offset)",ae);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʶ',(long)(int)offset,"(int)size",8,"8",(void *)0x0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʷ',(long)(int)lStack_30,"(int)offset",0,"0",(void *)0x0);
              assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʸ',(void *)size,"p","d1/file2","\"d1/file2\"",8,"8",
                                  (void *)0x0);
              iVar2 = archive_read_data_block
                                ((archive *)ae,(void **)&size,(size_t *)&offset,
                                 &stack0xffffffffffffffd0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʺ',1,"ARCHIVE_EOF",(long)iVar2,
                                  "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʻ',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ʼ',(long)(int)lStack_30,"(int)offset",8,"8",(void *)0x0);
            }
            else {
              pcVar4 = archive_entry_pathname((archive_entry *)p);
              iVar2 = strcmp(pcVar4,"h/ld1");
              if (iVar2 == 0) {
                mVar3 = archive_entry_filetype((archive_entry *)p);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                    ,L'ʾ',(ulong)mVar3,"archive_entry_filetype(ae)",0xa000,
                                    "AE_IFLNK",(void *)0x0);
              }
              else {
                pcVar4 = archive_entry_pathname((archive_entry *)p);
                iVar2 = strcmp(pcVar4,"h/d1/link1");
                if (iVar2 == 0) {
                  mVar3 = archive_entry_filetype((archive_entry *)p);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'ˁ',(ulong)mVar3,"archive_entry_filetype(ae)",0xa000,
                                      "AE_IFLNK",(void *)0x0);
                }
                else {
                  pcVar4 = archive_entry_pathname((archive_entry *)p);
                  iVar2 = strcmp(pcVar4,"h/d1/linkX");
                  if (iVar2 == 0) {
                    mVar3 = archive_entry_filetype((archive_entry *)p);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                        ,L'˄',(ulong)mVar3,"archive_entry_filetype(ae)",0xa000,
                                        "AE_IFLNK",(void *)0x0);
                  }
                  else {
                    pcVar4 = archive_entry_pathname((archive_entry *)p);
                    iVar2 = strcmp(pcVar4,"h/link2");
                    if (iVar2 == 0) {
                      mVar3 = archive_entry_filetype((archive_entry *)p);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                          ,L'ˇ',(ulong)mVar3,"archive_entry_filetype(ae)",0xa000,
                                          "AE_IFLNK",(void *)0x0);
                    }
                    else {
                      pcVar4 = archive_entry_pathname((archive_entry *)p);
                      iVar2 = strcmp(pcVar4,"h/linkY");
                      if (iVar2 == 0) {
                        mVar3 = archive_entry_filetype((archive_entry *)p);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                            ,L'ˊ',(ulong)mVar3,"archive_entry_filetype(ae)",0xa000,
                                            "AE_IFLNK",(void *)0x0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      mVar3 = archive_entry_filetype((archive_entry *)p);
      local_34 = iVar6;
      if (mVar3 == 0x4000) {
        wVar1 = archive_read_disk_descend((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'ˏ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_descend(a)",ae);
      }
    }
    iVar6 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'˓',1,"ARCHIVE_EOF",(long)iVar6,"archive_read_next_header2(a, ae)",ae);
    iVar6 = archive_read_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'˕',0,"ARCHIVE_OK",(long)iVar6,"archive_read_close(a)",(void *)0x0);
    iVar6 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'˗',0,"ARCHIVE_OK",(long)iVar6,"archive_read_free(a)",(void *)0x0);
    archive_entry_free((archive_entry *)p);
  }
  return;
}

Assistant:

static void
test_symlink_hybrid(void)
{
	struct archive *a;
	struct archive_entry *ae;
	const void *p;
	size_t size;
	int64_t offset;
	int file_count;

	if (!canSymlink()) {
		skipping("Can't test symlinks on this filesystem");
		return;
	}

	/*
	 * Create a sample archive.
	 */
	assertMakeDir("h", 0755);
	assertChdir("h");
	assertMakeDir("d1", 0755);
	assertMakeSymlink("ld1", "d1", 1);
	assertMakeFile("d1/file1", 0644, "d1/file1");
	assertMakeFile("d1/file2", 0644, "d1/file2");
	assertMakeSymlink("d1/link1", "file1", 0);
	assertMakeSymlink("d1/linkX", "fileX", 0);
	assertMakeSymlink("link2", "d1/file2", 0);
	assertMakeSymlink("linkY", "d1/fileY", 0);
	assertChdir("..");

	assert((ae = archive_entry_new()) != NULL);
	assert((a = archive_read_disk_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_set_symlink_hybrid(a));

	/*
	 * Specified file is a symbolic link file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "h/ld1"));
	file_count = 5;

	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		if (strcmp(archive_entry_pathname(ae), "h/ld1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/ld1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 8);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 8);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "d1/file1", 8);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 8);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/ld1/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 8);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 8);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "d1/file2", 8);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 8);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/ld1/link1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/ld1/linkX") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
		}
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));
	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/*
	 * Specified file is a directory and it has symbolic files.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "h"));
	file_count = 9;

	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		if (strcmp(archive_entry_pathname(ae), "h") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae), "h/d1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/d1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 8);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 8);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "d1/file1", 8);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 8);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/d1/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 8);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 8);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "d1/file2", 8);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 8);
		} else if (strcmp(archive_entry_pathname(ae), "h/ld1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/d1/link1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/d1/linkX") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/link2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
		} else if (strcmp(archive_entry_pathname(ae),
		    "h/linkY") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
		}
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));
	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	/* Destroy the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	archive_entry_free(ae);
}